

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O2

string * __thiscall
MinVR::VRDataIndex::_walkXML
          (string *__return_storage_ptr__,VRDataIndex *this,element *node,string *nameSpace)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  attribute *paVar6;
  iterator iVar7;
  iterator iVar8;
  element *this_00;
  VRError *this_01;
  char separator;
  VRDataIndex *this_02;
  VRCORETYPE_ID typeId;
  allocator<char> local_1cc;
  allocator<char> local_1cb;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  VRDataIndex *local_1c8;
  VRAttributeList al;
  undefined1 local_188 [32];
  string valueString;
  int local_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  VRContainer childNames;
  string qualifiedName;
  string local_e0 [32];
  string local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  qualifiedName._M_dataplus._M_p = (pointer)&qualifiedName.field_2;
  qualifiedName._M_string_length = 0;
  qualifiedName.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1c8 = this;
  pcVar5 = element::get_name(node);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&valueString,pcVar5,(allocator<char> *)local_188);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&al,nameSpace,
                 &valueString);
  std::__cxx11::string::operator=((string *)&qualifiedName,(string *)&al);
  std::__cxx11::string::~string((string *)&al);
  std::__cxx11::string::~string((string *)&valueString);
  element::get_value_abi_cxx11_((string *)&al,node);
  uVar1 = al._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  std::__cxx11::string::~string((string *)&al);
  if (uVar1 != 0) {
    paVar6 = element::get_attribute(node,"type");
    if (paVar6 != (attribute *)0x0) {
      paVar6 = element::get_attribute(node,"type");
      pcVar5 = attribute::get_value(paVar6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&al,pcVar5,(allocator<char> *)&valueString);
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>_>
                      *)VRDatum::typeMap_abi_cxx11_,(key_type *)&al);
      std::__cxx11::string::~string((string *)&al);
      if (iVar7._M_node == (_Base_ptr)(VRDatum::typeMap_abi_cxx11_ + 8)) {
        this_01 = (VRError *)__cxa_allocate_exception(0xa8);
        paVar6 = element::get_attribute(node,"type");
        pcVar5 = attribute::get_value(paVar6);
        std::__cxx11::string::string<std::allocator<char>>((string *)&valueString,pcVar5,&local_1c9)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&al,
                       "No known type called ",&valueString);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_188,"",&local_1ca);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,
                   "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.cpp"
                   ,&local_1cb);
        local_144 = 0x199;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&childNames,
                   "std::string MinVR::VRDataIndex::_walkXML(element *, std::string)",&local_1cc);
        VRError::VRError(this_01,(string *)&al,(string *)local_188,&local_140,&local_144,
                         (string *)&childNames);
        __cxa_throw(this_01,&VRError::typeinfo,VRError::~VRError);
      }
      typeId = iVar7._M_node[2]._M_color;
      goto LAB_00119a0c;
    }
    bVar2 = element::has_child(node);
    if (!bVar2) {
      this_02 = (VRDataIndex *)&al;
      element::get_value_abi_cxx11_((string *)this_02,node);
      typeId = _inferType(this_02,(string *)&al);
      std::__cxx11::string::~string((string *)&al);
      goto LAB_00119a0c;
    }
  }
  typeId = VRCORETYPE_CONTAINER;
LAB_00119a0c:
  paVar6 = element::get_attribute(node,"linkNode");
  if (paVar6 != (attribute *)0x0) {
    local_1c8->_linkNeeded = true;
  }
  paVar6 = element::get_attribute(node,"linkContent");
  if (paVar6 != (attribute *)0x0) {
    local_1c8->_linkNeeded = true;
  }
  valueString._M_dataplus._M_p = (pointer)&valueString.field_2;
  valueString._M_string_length = 0;
  valueString.field_2._M_local_buf[0] = '\0';
  element::get_value_abi_cxx11_((string *)&al,node);
  std::__cxx11::string::~string((string *)&al);
  if (al._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
    std::__cxx11::string::assign((char *)&valueString);
  }
  else {
    element::get_value_abi_cxx11_((string *)&al,node);
    std::__cxx11::string::operator=((string *)&valueString,(string *)&al);
    std::__cxx11::string::~string((string *)&al);
    uVar3 = std::__cxx11::string::find_first_not_of((char *)&valueString,0x12cd6b);
    uVar4 = std::__cxx11::string::find_last_not_of((char *)&valueString,0x12cd6b);
    if ((int)(uVar4 | uVar3) < 0) {
      std::__cxx11::string::assign((char *)&valueString);
      typeId = VRCORETYPE_CONTAINER;
    }
    else {
      std::__cxx11::string::substr((ulong)&al,(ulong)&valueString);
      std::__cxx11::string::operator=((string *)&valueString,(string *)&al);
      std::__cxx11::string::~string((string *)&al);
    }
  }
  paVar6 = element::get_attribute(node,"separator");
  if (paVar6 == (attribute *)0x0) {
    separator = ',';
  }
  else {
    paVar6 = element::get_attribute(node,"separator");
    pcVar5 = attribute::get_value(paVar6);
    separator = *pcVar5;
  }
  std::__cxx11::string::string((string *)&local_c0,(string *)&valueString);
  _processValue((string *)&al,local_1c8,&qualifiedName,&typeId,&local_c0,separator);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&al);
  std::__cxx11::string::~string((string *)&al);
  std::__cxx11::string::~string((string *)&local_c0);
  element::get_attribute_map_abi_cxx11_(&al,node);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_188,"type",(allocator<char> *)&local_140);
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&al._M_t,(key_type *)local_188);
  std::__cxx11::string::~string((string *)local_188);
  if ((_Rb_tree_header *)iVar8._M_node != &al._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_188,"type",(allocator<char> *)&local_140);
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&al._M_t,(key_type *)local_188);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&al,iVar8);
    std::__cxx11::string::~string((string *)local_188);
  }
  if (al._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"",(allocator<char> *)&local_140);
    _getDatum((VRDataIndex *)local_188,(string *)local_1c8,__return_storage_ptr__,SUB81(local_e0,0))
    ;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_a0,&al._M_t);
    VRDatum::setAttributeList((VRDatum *)local_188._0_8_,(VRAttributeList *)&local_a0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_a0);
    VRDatumPtr::~VRDatumPtr((VRDatumPtr *)local_188);
    std::__cxx11::string::~string(local_e0);
  }
  childNames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&childNames;
  childNames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  childNames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       childNames.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  while( true ) {
    this_00 = element::get_next_child(node);
    if (this_00 == (element *)0x0) break;
    std::operator+(&local_140,&qualifiedName,"/");
    pcVar5 = element::get_name(this_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   &local_140,pcVar5);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&childNames,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string((string *)&local_140);
    std::operator+(&local_70,&qualifiedName,"/");
    _walkXML(&local_50,local_1c8,this_00,&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&childNames.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&al._M_t);
  std::__cxx11::string::~string((string *)&valueString);
  std::__cxx11::string::~string((string *)&qualifiedName);
  return __return_storage_ptr__;
}

Assistant:

std::string VRDataIndex::_walkXML(element* node, std::string nameSpace) {
  // This method will return the name of the last top-level element in
  // the input XML.

  std::string qualifiedName;
  std::string out;

  qualifiedName = nameSpace + std::string(node->get_name());

  // What type is this node?
  VRCORETYPE_ID typeId;
  if (node->get_value().empty()) {
    // If the node has no value, we hope it's a container.
    typeId = VRCORETYPE_CONTAINER;

  } else if (node->get_attribute("type") == NULL) {

    if (node->has_child()) {

      typeId = VRCORETYPE_CONTAINER;
    } else {

      typeId = _inferType(std::string(node->get_value()));
    }

  } else {

    // Check to see if the type is one we can handle.
    VRDatum::VRTypeMap::iterator it =
      VRDatum::typeMap.find(std::string(node->get_attribute("type")->get_value()));

    if (it == VRDatum::typeMap.end()) {
      // If not, throw an error.
      VRERRORNOADV("No known type called " +
                   std::string(node->get_attribute("type")->get_value()));
    } else {
      // Otherwise, pass it along as the typeID.
      typeId = it->second;
    }
  }

  // Check to see if this is a link to anywhere.  If it is, signal
  // that we'll need the linking step after the deserialize.
  if (node->get_attribute("linkNode") != NULL) _linkNeeded = true;
  if (node->get_attribute("linkContent") != NULL) _linkNeeded = true;

  // Get a value for the node.
  std::string valueString;
  if (node->get_value().empty()) {

    valueString = "";

  } else {

    // Convert to a string for some minor editing.
    valueString = std::string(node->get_value());

    // Trim leading and trailing spaces, tabs, whatever.
    int firstChar = (int)valueString.find_first_not_of(" \t\r\n");
    int lastChar = (int)valueString.find_last_not_of(" \t\r\n");

    if ((firstChar >= 0) && (lastChar >= 0)) {

      valueString = valueString.substr(firstChar, (1 + lastChar - firstChar));

    } else {

      valueString = "";
      typeId = VRCORETYPE_CONTAINER;
    }
  }

  char separator;
  if (node->get_attribute("separator") == NULL) {

    separator = MINVRSEPARATOR;

  } else {

    separator = *(node->get_attribute("separator")->get_value());
  }

  out = _processValue(qualifiedName,
                     typeId,
                     valueString,
                     separator);

  // There should be a datum object entered for this by here.  So now
  // we can see if there are any attributes to add to the list.
  VRDatum::VRAttributeList al = node->get_attribute_map();
  if (al.find("type") != al.end()) al.erase(al.find("type"));
  if (al.size() > 0) {

    _getDatum(out)->setAttributeList(al);
  }

  // This loops through the node children, if there are any.
  VRContainer childNames;
  while (true) {

    // Pick the next child.
    element* child = node->get_next_child();
    if (child == NULL) {

      return out;
    }

    // Collect a child name on the container's child name list.
    childNames.push_back(qualifiedName + "/" + child->get_name());

    // And go walk its tree.
    _walkXML(child, qualifiedName + "/");
  }
}